

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

float __thiscall
tcu::ConstPixelBufferAccess::sample1DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,
          IVec2 *offset)

{
  WrapMode WVar1;
  undefined1 auVar2 [16];
  TextureChannelClass TVar3;
  uint uVar4;
  uint uVar5;
  TextureChannelClass TVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  undefined4 in_XMM0_Db;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  Vec4 p0Clr;
  Vector<float,_4> res;
  float local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  ConstPixelBufferAccess local_58;
  undefined1 auVar15 [16];
  
  local_58.m_size.m_data[2] = (int)ref;
  local_58.m_pitch.m_data[0] = in_XMM0_Db;
  TVar3 = getTextureChannelClass((this->m_format).type);
  if (sampler->normalizedCoords == true) {
    WVar1 = sampler->wrapS;
    if (WVar1 < WRAPMODE_LAST) {
      fVar13 = (float)(this->m_size).m_data[0];
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar14 = floorf(s);
          fVar14 = s - fVar14;
        }
        else {
          local_88._28_4_ = s * 0.5;
          fVar14 = floorf((float)local_88._28_4_);
          if (((float)local_88._28_4_ - fVar14 != 0.5) || (NAN((float)local_88._28_4_ - fVar14))) {
            fVar14 = floorf((float)local_88._28_4_ + 0.5);
          }
          else {
            fVar14 = 0.0;
            if (((long)((float)local_88._28_4_ + -0.5) & 1U) != 0) {
              fVar14 = 1.0;
            }
            fVar14 = (float)local_88._28_4_ + -0.5 + fVar14;
          }
          fVar14 = s - (fVar14 + fVar14);
          uVar12 = -(uint)(-fVar14 <= fVar14);
          fVar14 = (float)(~uVar12 & (uint)-fVar14 | (uint)fVar14 & uVar12);
        }
        s = fVar14 * fVar13;
      }
      else {
        s = s * fVar13;
      }
    }
    else {
      s = 0.0;
    }
  }
  if (filter != LINEAR) {
    if (filter != NEAREST) {
      return 0.0;
    }
    sampleNearest1D((ConstPixelBufferAccess *)local_88,(Sampler *)this,s,(IVec2 *)sampler);
    auVar18._0_8_ =
         CONCAT44(local_58.m_size.m_data[2],*(float *)(local_88 + (long)sampler->compareChannel * 4)
                 );
    auVar18._8_4_ = 0;
    auVar18._12_4_ = local_58.m_pitch.m_data[0];
    if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      auVar18 = minps(_DAT_00aa9040,auVar18);
      auVar18._0_8_ =
           CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar18._4_4_,
                    -(uint)(0.0 <= *(float *)(local_88 + (long)sampler->compareChannel * 4)) &
                    auVar18._0_4_);
    }
    fVar13 = (float)auVar18._0_8_;
    fVar14 = (float)(auVar18._0_8_ >> 0x20);
    switch(sampler->compare) {
    case COMPAREMODE_LESS:
      if (fVar13 <= fVar14) {
        return 0.0;
      }
      break;
    case COMPAREMODE_LESS_OR_EQUAL:
      if (fVar13 < fVar14) {
        return 0.0;
      }
      break;
    case COMPAREMODE_GREATER:
      if (fVar14 <= fVar13) {
        return 0.0;
      }
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      if (fVar14 < fVar13) {
        return 0.0;
      }
      break;
    case COMPAREMODE_EQUAL:
      if (fVar14 != fVar13) {
        return 0.0;
      }
      if (NAN(fVar14) || NAN(fVar13)) {
        return 0.0;
      }
      break;
    case COMPAREMODE_NOT_EQUAL:
      if ((fVar14 == fVar13) && (!NAN(fVar14) && !NAN(fVar13))) {
        return 0.0;
      }
      break;
    case COMPAREMODE_ALWAYS:
      break;
    default:
      return 0.0;
    }
    return 1.0;
  }
  uVar12 = (this->m_size).m_data[0];
  local_a8 = floorf(s + -0.5);
  uVar11 = offset->m_data[0] + (int)local_a8 + 1;
  WVar1 = sampler->wrapS;
  uVar8 = 0;
  iVar7 = (int)this;
  if (MIRRORED_ONCE < WVar1) {
LAB_00a35638:
    uVar4 = uVar11;
    if (WVar1 != MIRRORED_REPEAT_GL) {
      if (WVar1 != MIRRORED_ONCE) {
        uVar10 = 0;
        if (WVar1 == MIRRORED_REPEAT_CL) goto LAB_00a3564e;
        goto LAB_00a3569f;
      }
      uVar4 = uVar12;
      if ((int)uVar11 < (int)uVar12) {
        uVar4 = uVar11;
      }
      if (SBORROW4(uVar11,-uVar12) != (int)(uVar11 + uVar12) < 0) {
        uVar4 = -uVar12;
      }
    }
    iVar9 = (int)uVar4 % (int)(uVar12 * 2);
    uVar11 = (iVar9 - uVar12) + (iVar9 >> 0x1f & uVar12 * 2);
    uVar10 = ~((int)uVar11 >> 0x1f ^ uVar11) + uVar12;
    goto LAB_00a3569f;
  }
  uVar4 = offset->m_data[0] + (int)local_a8;
  uVar8 = uVar4;
  switch(WVar1) {
  case CLAMP_TO_EDGE:
    uVar10 = uVar12 - 1;
    uVar8 = uVar10;
    if ((int)uVar4 < (int)uVar10) {
      uVar8 = uVar4;
    }
    if ((int)uVar4 < 0) {
      uVar8 = 0;
    }
    if ((int)uVar11 < (int)uVar10) {
      uVar10 = uVar11;
    }
    if ((int)uVar11 < 0) {
      uVar10 = 0;
    }
    break;
  case CLAMP_TO_BORDER:
    uVar8 = uVar12;
    if ((int)uVar4 < (int)uVar12) {
      uVar8 = uVar4;
    }
    uVar5 = uVar8;
    if ((int)uVar4 < -1) {
      uVar5 = 0xffffffff;
    }
    uVar10 = uVar12;
    if ((int)uVar11 < (int)uVar12) {
      uVar10 = uVar11;
    }
    uVar4 = 0xffffffff;
    if (-2 < (int)uVar11) {
      uVar4 = uVar10;
    }
    if ((int)uVar5 < (int)uVar12 && -1 < (int)uVar5) {
      lookup((ConstPixelBufferAccess *)local_68,iVar7,uVar8,offset->m_data[1]);
    }
    else {
      TVar6 = getTextureChannelClass((this->m_format).type);
      switch(TVar6) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        sampleTextureBorder<float>((TextureFormat *)local_68,(Sampler *)this);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((TextureFormat *)local_88,(Sampler *)this);
        local_68._0_4_ = (undefined4)(int)local_88._0_4_;
        local_68._4_4_ = (undefined4)(int)local_88._4_4_;
        local_68._8_4_ = (undefined4)(int)local_88._8_4_;
        local_68._12_4_ = (undefined4)(int)local_88._12_4_;
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((TextureFormat *)local_88,(Sampler *)this);
        local_68._0_4_ =
             ((float)((uint)local_88._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_88._0_4_ & 0xffff | 0x4b000000);
        local_68._4_4_ =
             ((float)((uint)local_88._4_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_88._4_4_ & 0xffff | 0x4b000000);
        local_68._8_4_ =
             ((float)((uint)local_88._8_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_88._8_4_ & 0xffff | 0x4b000000);
        local_68._12_4_ =
             ((float)((uint)local_88._12_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_88._12_4_ & 0xffff | 0x4b000000);
        break;
      default:
        local_68._0_4_ = -1.0;
        local_68._4_4_ = -1.0;
        local_68._8_4_ = -1.0;
        local_68._12_4_ = -1.0;
      }
    }
    if ((int)uVar4 < (int)uVar12 && -1 < (int)uVar4) goto LAB_00a356bf;
    TVar6 = getTextureChannelClass((this->m_format).type);
    switch(TVar6) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)(local_68 + 0x10),(Sampler *)this);
      goto LAB_00a356d6;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((TextureFormat *)local_88,(Sampler *)this);
      local_58.m_format.order = (ChannelOrder)(float)(int)local_88._0_4_;
      local_58.m_format.type = (ChannelType)(float)(int)local_88._4_4_;
      local_58.m_size.m_data[0] = (int)(float)(int)local_88._8_4_;
      local_58.m_size.m_data[1] = (int)(float)(int)local_88._12_4_;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((TextureFormat *)local_88,(Sampler *)this);
      local_58.m_format.order =
           (ChannelOrder)
           (((float)((uint)local_88._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_88._0_4_ & 0xffff | 0x4b000000));
      local_58.m_format.type =
           (ChannelType)
           (((float)((uint)local_88._4_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_88._4_4_ & 0xffff | 0x4b000000));
      local_58.m_size.m_data[0] =
           (int)(((float)((uint)local_88._8_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(local_88._8_4_ & 0xffff | 0x4b000000));
      local_58.m_size.m_data[1] =
           (int)(((float)((uint)local_88._12_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(local_88._12_4_ & 0xffff | 0x4b000000));
      break;
    default:
      local_58.m_format.order = 0xbf800000;
      local_58.m_format.type = 0xbf800000;
      local_58.m_size.m_data[0] = -0x40800000;
      local_58.m_size.m_data[1] = -0x40800000;
    }
    goto LAB_00a356d6;
  default:
    uVar8 = ((int)uVar4 % (int)uVar12 >> 0x1f & uVar12) + (int)uVar4 % (int)uVar12;
    uVar10 = ((int)uVar11 % (int)uVar12 >> 0x1f & uVar12) + (int)uVar11 % (int)uVar12;
    break;
  case MIRRORED_REPEAT_CL:
    uVar10 = uVar12 - 1;
    if ((int)uVar4 < (int)(uVar12 - 1)) {
      uVar10 = uVar4;
    }
    uVar8 = 0;
    if (-1 < (int)uVar4) {
      uVar8 = uVar10;
    }
LAB_00a3564e:
    uVar4 = uVar12 - 1;
    if ((int)uVar11 < (int)(uVar12 - 1)) {
      uVar4 = uVar11;
    }
    uVar10 = 0;
    if (-1 < (int)uVar11) {
      uVar10 = uVar4;
    }
    break;
  case MIRRORED_ONCE:
    uVar8 = uVar12;
    if ((int)uVar4 < (int)uVar12) {
      uVar8 = uVar4;
    }
    if (SBORROW4(uVar4,-uVar12) != (int)(uVar4 + uVar12) < 0) {
      uVar8 = -uVar12;
    }
  case MIRRORED_REPEAT_GL:
    iVar9 = (int)uVar8 % (int)(uVar12 * 2);
    uVar8 = (iVar9 - uVar12) + (iVar9 >> 0x1f & uVar12 * 2);
    uVar8 = ~((int)uVar8 >> 0x1f ^ uVar8) + uVar12;
    goto LAB_00a35638;
  }
LAB_00a3569f:
  lookup((ConstPixelBufferAccess *)local_68,iVar7,uVar8,offset->m_data[1]);
LAB_00a356bf:
  lookup((ConstPixelBufferAccess *)(local_68 + 0x10),iVar7,uVar10,offset->m_data[1]);
LAB_00a356d6:
  local_a8 = (s + -0.5) - local_a8;
  fVar13 = *(float *)(local_68 + (long)sampler->compareChannel * 4);
  auVar16._4_8_ = 0;
  auVar16._0_4_ = fVar13;
  auVar16._12_4_ = local_58.m_pitch.m_data[0];
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._0_8_ = CONCAT44(local_58.m_size.m_data[2],fVar13);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar18 = minps(_DAT_00aa9040,auVar15);
    auVar15._0_8_ =
         CONCAT44(-(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar18._4_4_,
                  -(uint)(0.0 <= fVar13) & auVar18._0_4_);
  }
  fVar17 = 0.0;
  iVar7 = sampler->compare - COMPAREMODE_LESS;
  fVar13 = (float)auVar15._0_8_;
  fVar14 = (float)((ulong)auVar15._0_8_ >> 0x20);
  switch(iVar7) {
  case 0:
    if (fVar14 < fVar13) goto switchD_00a35721_caseD_6;
    break;
  case 1:
    if (fVar14 <= fVar13) goto switchD_00a35721_caseD_6;
    break;
  case 2:
    if (fVar13 < fVar14) goto switchD_00a35721_caseD_6;
    break;
  case 3:
    if (fVar13 <= fVar14) goto switchD_00a35721_caseD_6;
    break;
  case 4:
    if ((fVar14 == fVar13) && (!NAN(fVar14) && !NAN(fVar13))) goto switchD_00a35721_caseD_6;
    break;
  case 5:
    if ((fVar14 != fVar13) || (NAN(fVar14) || NAN(fVar13))) goto switchD_00a35721_caseD_6;
    break;
  case 6:
switchD_00a35721_caseD_6:
    fVar17 = 1.0;
  }
  fVar13 = *(float *)(local_68 + (long)sampler->compareChannel * 4 + 0x10);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    auVar2._4_4_ = local_58.m_size.m_data[2];
    auVar2._0_4_ = fVar13;
    auVar2._8_4_ = local_58.m_size.m_data[2];
    auVar2._12_4_ = local_58.m_size.m_data[2];
    auVar18 = minps(_DAT_00aa9040,auVar2);
    fVar13 = (float)(-(uint)(0.0 <= fVar13) & auVar18._0_4_);
    local_58.m_size.m_data[2] = -(uint)(0.0 <= (float)local_58.m_size.m_data[2]) & auVar18._4_4_;
  }
  fVar14 = 0.0;
  switch(iVar7) {
  case 0:
    if (fVar13 <= (float)local_58.m_size.m_data[2]) goto switchD_00a357aa_default;
    break;
  case 1:
    if (fVar13 < (float)local_58.m_size.m_data[2]) goto switchD_00a357aa_default;
    break;
  case 2:
    if ((float)local_58.m_size.m_data[2] <= fVar13) goto switchD_00a357aa_default;
    break;
  case 3:
    if ((float)local_58.m_size.m_data[2] < fVar13) goto switchD_00a357aa_default;
    break;
  case 4:
    if (((float)local_58.m_size.m_data[2] != fVar13) ||
       (NAN((float)local_58.m_size.m_data[2]) || NAN(fVar13))) goto switchD_00a357aa_default;
    break;
  case 5:
    if (((float)local_58.m_size.m_data[2] == fVar13) &&
       (!NAN((float)local_58.m_size.m_data[2]) && !NAN(fVar13))) goto switchD_00a357aa_default;
    break;
  case 6:
    break;
  default:
    goto switchD_00a357aa_default;
  }
  fVar14 = 1.0;
switchD_00a357aa_default:
  return fVar14 * local_a8 + fVar17 * (1.0 - local_a8);
}

Assistant:

float ConstPixelBufferAccess::sample1DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest1D(*this, sampler, u, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear1DCompare(*this, sampler, ref, u, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}